

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O2

bool __thiscall
Clasp::SolveAlgorithm::attach(SolveAlgorithm *this,SharedContext *ctx,ModelHandler *onModel)

{
  bool bVar1;
  int iVar2;
  Enumerator *x;
  double dVar3;
  
  if (this->ctx_ != (SharedContext *)0x0) {
    Potassco::fail(-2,"bool Clasp::SolveAlgorithm::attach(SharedContext &, ModelHandler *)",0x11c,
                   "!ctx_","SolveAlgorithm is already running!",0);
  }
  if (((ctx->share_).field_0x3 & 2) == 0) {
    SharedContext::endInit(ctx,false);
  }
  SharedContext::report(ctx,subsystem_solve);
  if (((((*(ctx->solvers_).ebo_.buf)->conflict_).ebo_.size == 0) && ((this->limits_).conflicts != 0)
      ) && (iVar2 = (*this->_vptr_SolveAlgorithm[2])(this), (char)iVar2 == '\0')) {
    this->ctx_ = ctx;
    dVar3 = ThreadTime::getTime();
    this->time_ = dVar3;
    this->onModel_ = onModel;
    this->last_ = 0;
    SingleOwnerPtr<bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>,_Clasp::DeleteObject>
    ::reset(&this->core_,(pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x0);
    if (1 < (this->enum_).ptr_) {
      return true;
    }
    x = EnumOptions::nullEnumerator();
    SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::reset(&this->enum_,x);
    return true;
  }
  bVar1 = SharedContext::ok(ctx);
  this->last_ = (uint)!bVar1 * 2;
  return false;
}

Assistant:

bool SolveAlgorithm::attach(SharedContext& ctx, ModelHandler* onModel) {
	POTASSCO_REQUIRE(!ctx_, "SolveAlgorithm is already running!");
	if (!ctx.frozen()) { ctx.endInit(); }
	ctx.report(Event::subsystem_solve);
	if (ctx.master()->hasConflict() || !limits_.conflicts || interrupted()) {
		last_  = !ctx.ok() ? value_false : value_free;
		return false;
	}
	ctx_     = &ctx;
	time_    = ThreadTime::getTime();
	onModel_ = onModel;
	last_    = value_free;
	core_.reset(0);
	if (!enum_.get()) { enum_ = EnumOptions::nullEnumerator(); }
	return true;
}